

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

UnaryOp __thiscall
wasm::Random::pick<wasm::UnaryOp>(Random *this,FeatureOptions<wasm::UnaryOp> *picker)

{
  UnaryOp UVar1;
  value_type *pvVar2;
  _Vector_base<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_> local_30;
  
  items<wasm::UnaryOp>
            ((vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_> *)&local_30,this,picker);
  pvVar2 = pick<std::vector<wasm::UnaryOp,std::allocator<wasm::UnaryOp>>>
                     (this,(vector<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_> *)&local_30);
  UVar1 = *pvVar2;
  std::_Vector_base<wasm::UnaryOp,_std::allocator<wasm::UnaryOp>_>::~_Vector_base(&local_30);
  return UVar1;
}

Assistant:

const T pick(FeatureOptions<T>& picker) {
    return pick(items(picker));
  }